

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushOverrideID(ImGuiID id)

{
  uint local_4;
  
  ImVector<unsigned_int>::push_back(&GImGui->CurrentWindow->IDStack,&local_4);
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(id);
}